

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# castchannel.h
# Opt level: O0

bool __thiscall
CastMessage::out_content
          (CastMessage *this,
          basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
          *pout)

{
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  uchar *pcls;
  size_type size;
  bool local_19;
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
  *pout_local;
  CastMessage *this_local;
  
  bVar1 = ec::msg_protoc3::
          out_var<unsigned_int,std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>,void>
                    ((msg_protoc3 *)this,pout,1,this->_protocol_version,true);
  local_19 = false;
  if (bVar1) {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    bVar1 = ec::msg_protoc3::
            out_str<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>
                      ((msg_protoc3 *)this,pout,2,pcVar3);
    local_19 = false;
    if (bVar1) {
      pcVar3 = (char *)std::__cxx11::string::c_str();
      bVar1 = ec::msg_protoc3::
              out_str<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>
                        ((msg_protoc3 *)this,pout,3,pcVar3);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      bVar2 = ec::msg_protoc3::
              out_str<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>
                        ((msg_protoc3 *)this,pout,4,pcVar3);
      local_19 = false;
      if ((char)(bVar1 + bVar2) != '\0') {
        bVar1 = ec::msg_protoc3::
                out_var<unsigned_int,std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>,void>
                          ((msg_protoc3 *)this,pout,5,this->_payload_type,true);
        local_19 = false;
        if (bVar1) {
          pcVar3 = (char *)std::__cxx11::string::c_str();
          bVar1 = ec::msg_protoc3::
                  out_str<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>
                            ((msg_protoc3 *)this,pout,6,pcVar3);
          local_19 = false;
          if (bVar1) {
            pcls = std::__cxx11::
                   basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
                   ::data(&this->_payload_binary);
            size = std::__cxx11::
                   basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
                   ::size(&this->_payload_binary);
            local_19 = ec::msg_protoc3::
                       out_cls<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>
                                 ((msg_protoc3 *)this,pout,7,pcls,size);
          }
        }
      }
    }
  }
  return local_19;
}

Assistant:

bool out_content(std::basic_string<uint8_t> *pout) override {
        return
            out_var(pout, id_protocol_version, _protocol_version, true) &&
            out_str(pout, id_source_id, _source_id.c_str()) &&
            out_str(pout, id_destination_id, _destination_id.c_str()) +
            out_str(pout, id_namespace, _namespace.c_str()) &&
            out_var(pout, id_payload_type, _payload_type, true) &&
            out_str(pout, id_payload_utf8, _payload_utf8.c_str()) &&
            out_cls(pout, id_payload_binary, _payload_binary.data(), _payload_binary.size());
    }